

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::RealReconstructionWithTVL1
               (Mat *x,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float lambda,
               Size *patchSize,float patchMean)

{
  bool bVar1;
  ostream *this;
  float fVar2;
  float fVar3;
  double dVar4;
  _OutputArray local_898;
  Mat local_880 [352];
  MatExpr local_720 [352];
  double local_5c0;
  double local_5b8;
  _OutputArray local_5b0;
  double local_598;
  double local_590;
  double local_588;
  int local_57c;
  undefined1 local_578 [4];
  int i;
  _InputArray local_558;
  MatSize local_540 [8];
  Scalar_<double> local_538;
  _InputArray local_518;
  MatSize local_500 [8];
  Scalar_<double> local_4f8;
  _InputArray local_4d8;
  MatSize local_4c0 [8];
  _OutputArray local_4b8;
  Scalar_<double> local_4a0;
  _InputArray local_480;
  _OutputArray local_468;
  Scalar_<double> local_450;
  _InputArray local_430;
  MatSize local_408 [8];
  undefined1 local_400 [8];
  Mat q;
  Mat local_3a0 [8];
  Mat divP;
  undefined1 local_340 [8];
  Mat p2;
  undefined1 local_2e0 [8];
  Mat p1;
  Mat local_280 [8];
  Mat Du2;
  Mat local_220 [8];
  Mat Du1;
  Mat local_1c0 [8];
  Mat u_nm1;
  undefined1 local_160 [8];
  Mat u_n;
  undefined1 local_100 [8];
  Mat Au;
  Mat local_a0 [8];
  Mat u_;
  float sigma;
  float tau;
  float L2;
  float patchMean_local;
  Size *patchSize_local;
  float lambda_local;
  int iterations_local;
  Mat *binaryDescriptor_local;
  LBDOperator *LBD_local;
  Mat *x_local;
  
  fVar2 = LinearOperator::norm(&LBD->super_LinearOperator);
  fVar3 = LinearOperator::norm(&LBD->super_LinearOperator);
  fVar2 = fVar2 * fVar3 + 8.0;
  dVar4 = std::sqrt((double)(ulong)(uint)fVar2);
  fVar3 = 1.0 / SUB84(dVar4,0);
  dVar4 = std::sqrt((double)(ulong)(uint)fVar2);
  fVar2 = 1.0 / SUB84(dVar4,0);
  cv::Mat::Mat(local_a0);
  cv::Mat::Mat((Mat *)local_100);
  cv::Mat::Mat((Mat *)local_160);
  cv::Mat::Mat(local_1c0);
  cv::Mat::Mat(local_220);
  cv::Mat::Mat(local_280);
  cv::Mat::Mat((Mat *)local_2e0);
  cv::Mat::Mat((Mat *)local_340);
  cv::Mat::Mat(local_3a0);
  cv::Mat::Mat((Mat *)local_400);
  cv::MatSize::operator()(local_408);
  cv::Mat::create(local_100,local_408,5);
  cv::Scalar_<double>::Scalar_(&local_450,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_430,(Matx<double,_4,_1> *)&local_450);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_100,&local_430);
  cv::_InputArray::~_InputArray(&local_430);
  if (*(long *)(x + 0x10) == 0) {
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,binaryDescriptor,local_160);
    cv::Scalar_<double>::Scalar_(&local_4a0,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_480,(Matx<double,_4,_1> *)&local_4a0);
    cv::noArray();
    cv::Mat::setTo((_InputArray *)local_160,&local_480);
    cv::_InputArray::~_InputArray(&local_480);
  }
  else {
    cv::_OutputArray::_OutputArray(&local_468,(Mat *)local_160);
    cv::Mat::copyTo((_OutputArray *)x);
    cv::_OutputArray::~_OutputArray(&local_468);
  }
  cv::_OutputArray::_OutputArray(&local_4b8,local_a0);
  cv::Mat::copyTo((_OutputArray *)local_160);
  cv::_OutputArray::~_OutputArray(&local_4b8);
  cv::MatSize::operator()(local_4c0);
  cv::Mat::create(local_2e0,local_4c0,5);
  cv::Scalar_<double>::Scalar_(&local_4f8,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_4d8,(Matx<double,_4,_1> *)&local_4f8);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_2e0,&local_4d8);
  cv::_InputArray::~_InputArray(&local_4d8);
  cv::MatSize::operator()(local_500);
  cv::Mat::create(local_340,local_500,5);
  cv::Scalar_<double>::Scalar_(&local_538,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_518,(Matx<double,_4,_1> *)&local_538);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_340,&local_518);
  cv::_InputArray::~_InputArray(&local_518);
  cv::MatSize::operator()(local_540);
  cv::Mat::create(local_400,local_540,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_578,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_558,(Matx<double,_4,_1> *)local_578);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)local_400,&local_558);
  cv::_InputArray::~_InputArray(&local_558);
  for (local_57c = 0; local_57c < iterations; local_57c = local_57c + 1) {
    HorizontalGradientWithForwardScheme(local_a0,local_220);
    local_588 = (double)fVar2;
    cv::operator*=(local_220,&local_588);
    cv::operator+=((Mat *)local_2e0,local_220);
    VerticalGradientWithForwardScheme(local_a0,local_280);
    local_590 = (double)fVar2;
    cv::operator*=(local_280,&local_590);
    cv::operator+=((Mat *)local_340,local_280);
    ProxL2UnitBall((Mat *)local_2e0,(Mat *)local_340);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[2])(LBD,local_a0,local_100);
    cv::operator-=((Mat *)local_100,binaryDescriptor);
    local_598 = (double)fVar2;
    cv::operator*=((Mat *)local_100,&local_598);
    cv::operator+=((Mat *)local_400,(Mat *)local_100);
    ProxRangeConstraint((Mat *)local_400,-lambda,lambda);
    cv::_OutputArray::_OutputArray(&local_5b0,local_1c0);
    cv::Mat::copyTo((_OutputArray *)local_160);
    cv::_OutputArray::~_OutputArray(&local_5b0);
    DivergenceWithBackwardScheme((Mat *)local_2e0,(Mat *)local_340,local_3a0);
    local_5b8 = (double)fVar3;
    cv::operator*=(local_3a0,&local_5b8);
    (*(LBD->super_LinearOperator)._vptr_LinearOperator[3])(LBD,local_400,local_100);
    local_5c0 = (double)fVar3;
    cv::operator*=((Mat *)local_100,&local_5c0);
    cv::operator-=((Mat *)local_160,(Mat *)local_100);
    cv::operator+=((Mat *)local_160,local_3a0);
    bVar1 = cv::Mat::isContinuous((Mat *)local_160);
    if (!bVar1) {
      this = std::operator<<((ostream *)&std::cerr,"OOOOOOPS, things can go wild...");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    ProxMeanConstraint((Mat *)local_160,patchMean);
    ProxRangeConstraint((Mat *)local_160,0.0,1.0);
    cv::operator*(2.0,local_880);
    cv::operator-(local_720,local_880);
    cv::Mat::operator=(local_a0,local_720);
    cv::MatExpr::~MatExpr(local_720);
    cv::MatExpr::~MatExpr((MatExpr *)local_880);
  }
  cv::_OutputArray::_OutputArray(&local_898,x);
  cv::Mat::copyTo((_OutputArray *)local_160);
  cv::_OutputArray::~_OutputArray(&local_898);
  cv::Mat::~Mat((Mat *)local_400);
  cv::Mat::~Mat(local_3a0);
  cv::Mat::~Mat((Mat *)local_340);
  cv::Mat::~Mat((Mat *)local_2e0);
  cv::Mat::~Mat(local_280);
  cv::Mat::~Mat(local_220);
  cv::Mat::~Mat(local_1c0);
  cv::Mat::~Mat((Mat *)local_160);
  cv::Mat::~Mat((Mat *)local_100);
  cv::Mat::~Mat(local_a0);
  return;
}

Assistant:

void lts2::RealReconstructionWithTVL1(cv::Mat &x, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                     int iterations, float lambda, cv::Size patchSize, float patchMean)
{
  // Numerical parameters
  float L2 = 8.0f + LBD.norm() * LBD.norm();    // 8 is for TV
  float tau = 1.0f / std::sqrt(L2);   // L^2 * tau * sigma = 1
  float sigma = 1.0f / std::sqrt(L2); // L^2 * tau * sigma = 1

  // Auxiliary variables
  cv::Mat u_, Au, u_n, u_nm1, Du1, Du2;
  cv::Mat p1, p2, divP;       // Dual variables for TV
  cv::Mat q;                  // Dual variable for A

  // We observe g, hence g and Au have the same dimensions
  Au.create(binaryDescriptor.size(), CV_32F);
  Au.setTo(cv::Scalar(0));

  // The size of u may not be the same as the size of g (e.g. A is a projection)
  // so we guess the size of u either from a non-zero input, or from the application
  // of A^t.
  if (x.data)
    x.copyTo(u_n);
  else
  {
    LBD.ApplyConjugate(binaryDescriptor, u_n);
    u_n.setTo(cv::Scalar(0));
  }

  u_n.copyTo(u_);

  p1.create(u_.size(), CV_32FC1);
  p1.setTo(cv::Scalar(0));
  p2.create(u_.size(), CV_32FC1);
  p2.setTo(cv::Scalar(0));

  q.create(binaryDescriptor.size(), CV_32F);
  q.setTo(cv::Scalar(0));

  // Main loop
  for (int i = 0; i < iterations; ++i)
  {
    //-------------------------------
    // Solve the dual (F^\star, K)
    //-------------------------------

    // K = (\nabla, A)
    // Apply K to U_, add to the dual variable

    // First part: TV
    lts2::HorizontalGradientWithForwardScheme(u_, Du1);
    Du1 *= sigma;
    p1 += Du1;

    lts2::VerticalGradientWithForwardScheme(u_, Du2);
    Du2 *= sigma;
    p2 += Du2;

    lts2::ProxL2UnitBall(p1, p2);

    // Second part: Au
    LBD.Apply(u_, Au);
    Au -= binaryDescriptor;
    Au *= sigma;
    q += Au;
    lts2::ProxRangeConstraint(q, -lambda, lambda);

    // Compute the prox

    //-------------------------------
    // Solve the primal (G, K^\star)
    //-------------------------------

    // Save the current estimate
    u_n.copyTo(u_nm1);

    // Apply K^\star to the dual variable
    // TV
    lts2::DivergenceWithBackwardScheme(p1, p2, divP);
    divP *= tau;

    // Operator A
    LBD.ApplyConjugate(q, Au);
    Au *= tau;

    // Solve the prox                                                                                                                                                   
    u_n -= Au;
    u_n += divP;

    // Enforce the range of the data [0, 1] and the mean
    if (!u_n.isContinuous())
      std::cerr << "OOOOOOPS, things can go wild..." << std::endl;

    lts2::ProxMeanConstraint(u_n, patchMean);
    lts2::ProxRangeConstraint(u_n, 0.0, 1.0);

    //-------------------------------
    // Next iteration
    //-------------------------------
    u_ = 2.0f * u_n - u_nm1;
  }

  u_n.copyTo(x);
}